

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

scalar_function_t *
duckdb::GetBinaryFunctionIgnoreZero<duckdb::ModuloOperator>
          (scalar_function_t *__return_storage_ptr__,PhysicalType type)

{
  int iVar1;
  code *pcVar2;
  NotImplementedException *this;
  undefined7 in_register_00000031;
  string local_40;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  switch(iVar1) {
  case 2:
    pcVar2 = 
    BinaryScalarFunctionIgnoreZero<unsigned_char,unsigned_char,unsigned_char,duckdb::ModuloOperator,duckdb::BinaryZeroIsNullWrapper>
    ;
    break;
  case 3:
    pcVar2 = 
    BinaryScalarFunctionIgnoreZero<signed_char,signed_char,signed_char,duckdb::ModuloOperator,duckdb::BinaryNumericDivideWrapper>
    ;
    break;
  case 4:
    pcVar2 = 
    BinaryScalarFunctionIgnoreZero<unsigned_short,unsigned_short,unsigned_short,duckdb::ModuloOperator,duckdb::BinaryZeroIsNullWrapper>
    ;
    break;
  case 5:
    pcVar2 = 
    BinaryScalarFunctionIgnoreZero<short,short,short,duckdb::ModuloOperator,duckdb::BinaryNumericDivideWrapper>
    ;
    break;
  case 6:
    pcVar2 = 
    BinaryScalarFunctionIgnoreZero<unsigned_int,unsigned_int,unsigned_int,duckdb::ModuloOperator,duckdb::BinaryZeroIsNullWrapper>
    ;
    break;
  case 7:
    pcVar2 = 
    BinaryScalarFunctionIgnoreZero<int,int,int,duckdb::ModuloOperator,duckdb::BinaryNumericDivideWrapper>
    ;
    break;
  case 8:
    pcVar2 = 
    BinaryScalarFunctionIgnoreZero<unsigned_long,unsigned_long,unsigned_long,duckdb::ModuloOperator,duckdb::BinaryZeroIsNullWrapper>
    ;
    break;
  case 9:
    pcVar2 = 
    BinaryScalarFunctionIgnoreZero<long,long,long,duckdb::ModuloOperator,duckdb::BinaryNumericDivideWrapper>
    ;
    break;
  case 10:
switchD_0104bc59_caseD_a:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unimplemented type for GetScalarUnaryFunction","");
    NotImplementedException::NotImplementedException(this,&local_40);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 0xb:
    pcVar2 = 
    BinaryScalarFunctionIgnoreZero<float,float,float,duckdb::ModuloOperator,duckdb::BinaryZeroIsNullWrapper>
    ;
    break;
  case 0xc:
    pcVar2 = 
    BinaryScalarFunctionIgnoreZero<double,double,double,duckdb::ModuloOperator,duckdb::BinaryZeroIsNullWrapper>
    ;
    break;
  default:
    if (iVar1 == 0xcb) {
      pcVar2 = 
      BinaryScalarFunctionIgnoreZero<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::ModuloOperator,duckdb::BinaryZeroIsNullWrapper>
      ;
    }
    else {
      if (iVar1 != 0xcc) goto switchD_0104bc59_caseD_a;
      pcVar2 = 
      BinaryScalarFunctionIgnoreZero<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ModuloOperator,duckdb::BinaryNumericDivideHugeintWrapper>
      ;
    }
  }
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = pcVar2;
  __return_storage_ptr__->_M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  return (scalar_function_t *)
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_manager;
}

Assistant:

static scalar_function_t GetBinaryFunctionIgnoreZero(PhysicalType type) {
	switch (type) {
	case PhysicalType::INT8:
		return BinaryScalarFunctionIgnoreZero<int8_t, int8_t, int8_t, OP, BinaryNumericDivideWrapper>;
	case PhysicalType::INT16:
		return BinaryScalarFunctionIgnoreZero<int16_t, int16_t, int16_t, OP, BinaryNumericDivideWrapper>;
	case PhysicalType::INT32:
		return BinaryScalarFunctionIgnoreZero<int32_t, int32_t, int32_t, OP, BinaryNumericDivideWrapper>;
	case PhysicalType::INT64:
		return BinaryScalarFunctionIgnoreZero<int64_t, int64_t, int64_t, OP, BinaryNumericDivideWrapper>;
	case PhysicalType::UINT8:
		return BinaryScalarFunctionIgnoreZero<uint8_t, uint8_t, uint8_t, OP>;
	case PhysicalType::UINT16:
		return BinaryScalarFunctionIgnoreZero<uint16_t, uint16_t, uint16_t, OP>;
	case PhysicalType::UINT32:
		return BinaryScalarFunctionIgnoreZero<uint32_t, uint32_t, uint32_t, OP>;
	case PhysicalType::UINT64:
		return BinaryScalarFunctionIgnoreZero<uint64_t, uint64_t, uint64_t, OP>;
	case PhysicalType::INT128:
		return BinaryScalarFunctionIgnoreZero<hugeint_t, hugeint_t, hugeint_t, OP, BinaryNumericDivideHugeintWrapper>;
	case PhysicalType::UINT128:
		return BinaryScalarFunctionIgnoreZero<uhugeint_t, uhugeint_t, uhugeint_t, OP>;
	case PhysicalType::FLOAT:
		return BinaryScalarFunctionIgnoreZero<float, float, float, OP>;
	case PhysicalType::DOUBLE:
		return BinaryScalarFunctionIgnoreZero<double, double, double, OP>;
	default:
		throw NotImplementedException("Unimplemented type for GetScalarUnaryFunction");
	}
}